

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.cpp
# Opt level: O0

void __thiscall
database::Container::_UpdateValueForIndex
          (Container *this,size_t *index,impl_insert_update_type *new_value)

{
  bool bVar1;
  reference ppVar2;
  iterator __first;
  iterator __last;
  size_type __n;
  pointer this_00;
  reference this_01;
  reference this_02;
  size_t column_index;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparableString>
  pair;
  const_iterator __end1;
  const_iterator __begin1;
  impl_insert_update_type *__range1;
  impl_insert_update_type *new_value_local;
  size_t *index_local;
  Container *this_local;
  
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparableString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparableString>_>_>
          ::empty(new_value);
  if (!bVar1) {
    __end1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparableString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparableString>_>_>
             ::begin(new_value);
    pair.second.m_string.field_2._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparableString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparableString>_>_>
         ::end(new_value);
    while (bVar1 = std::operator!=(&__end1,(_Self *)((long)&pair.second.m_string.field_2 + 8)),
          bVar1) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparableString>_>
               ::operator*(&__end1);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparableString>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparableString>
              *)&column_index,ppVar2);
      __first = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>_>
                ::begin(&this->m_schema);
      __last = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>_>
               ::find(&this->m_schema,(key_type *)&column_index);
      __n = std::
            distance<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,database::DataType>>>
                      ((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>
                        )__first._M_node,
                       (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>
                        )__last._M_node);
      this_00 = std::
                unique_ptr<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
                ::operator->(&this->m_data);
      this_01 = std::
                vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>
                ::operator[](this_00,__n);
      this_02 = std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>
                ::operator[](this_01,*index);
      ComparableString::operator=(this_02,(ComparableString *)((long)&pair.first.field_2 + 8));
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparableString>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparableString>
               *)&column_index);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparableString>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void database::Container::_UpdateValueForIndex(const size_t& index,const database::impl_insert_update_type& new_value)
{
  if(new_value.empty()) return;
  for(auto pair: new_value)
  {
    size_t column_index = std::distance(m_schema.begin(),m_schema.find(pair.first));
    m_data -> operator[](column_index)[index] = pair.second;
  }
}